

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O2

ze_result_t
loader::zeCommandListCreateImmediate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_command_queue_desc_t *altdesc,
          ze_command_list_handle_t *phCommandList)

{
  ze_pfnCommandListCreateImmediate_t p_Var1;
  ze_result_t zVar2;
  object_t<_ze_command_list_handle_t_*> *poVar3;
  dditable_t *dditable;
  dditable_t *local_10;
  
  local_10 = *(dditable_t **)(hContext + 8);
  p_Var1 = (local_10->ze).CommandList.pfnCreateImmediate;
  if (p_Var1 == (ze_pfnCommandListCreateImmediate_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar2 = (*p_Var1)(*(ze_context_handle_t *)hContext,*(ze_device_handle_t *)hDevice,altdesc,
                      phCommandList);
    if (zVar2 == ZE_RESULT_SUCCESS) {
      poVar3 = singleton_factory_t<object_t<_ze_command_list_handle_t*>,_ze_command_list_handle_t*>
               ::getInstance<_ze_command_list_handle_t*&,dditable_t*&>
                         (context,phCommandList,&local_10);
      *phCommandList = (ze_command_list_handle_t)poVar3;
      zVar2 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListCreateImmediate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        const ze_command_queue_desc_t* altdesc,         ///< [in] pointer to command queue descriptor
        ze_command_list_handle_t* phCommandList         ///< [out] pointer to handle of command list object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_context_object_t*>( hContext )->dditable;
        auto pfnCreateImmediate = dditable->ze.CommandList.pfnCreateImmediate;
        if( nullptr == pfnCreateImmediate )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<ze_context_object_t*>( hContext )->handle;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<ze_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnCreateImmediate( hContext, hDevice, altdesc, phCommandList );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phCommandList = reinterpret_cast<ze_command_list_handle_t>(
                context->ze_command_list_factory.getInstance( *phCommandList, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }